

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-timerfd.c
# Opt level: O2

void dotest(int clockid)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  timespec tVar9;
  timespec tVar10;
  int fd;
  uint64_t counter;
  pollfd pfd;
  itimerspec tout;
  itimerspec t8;
  pthread_t th2;
  itimerspec t4;
  itimerspec t9;
  itimerspec t7;
  itimerspec t6;
  itimerspec t5;
  itimerspec t46;
  itimerspec t45;
  itimerspec t3;
  itimerspec t2;
  itimerspec t1;
  char buf [1024];
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  fd = timerfd_create(clockid,0x800);
  if (fd < 0) {
    pcVar5 = "timerfd_create(clockid, TFD_NONBLOCK)";
  }
  else {
    if (*piVar2 == 0) {
      pfd.events = 1;
      pfd.revents = 0;
      pfd.fd = fd;
      iVar1 = poll((pollfd *)&pfd,1,0);
      if (iVar1 != 0) {
        pcVar7 = "0";
        pcVar5 = "poll(&pfd, 1, 0)";
        uVar8 = 0xa3;
        goto LAB_00102f43;
      }
      sVar3 = read(fd,buf,0x400);
      if (sVar3 == -1) {
        if (*piVar2 == 0xb) {
          sVar3 = read(fd,buf,7);
          if (sVar3 == -1) {
            if (*piVar2 == 0x16) {
              t1.it_value.tv_sec = 0;
              t1.it_value.tv_nsec = 500000000;
              t1.it_interval.tv_sec = 0;
              t1.it_interval.tv_nsec = 0;
              *piVar2 = 0;
              iVar1 = timerfd_settime(fd,0,(itimerspec *)&t1,(itimerspec *)0x0);
              if (iVar1 < 0) {
                pcVar5 = "timerfd_settime(fd, 0, &t1, NULL)";
              }
              else {
                if (*piVar2 == 0) {
                  sVar3 = read(fd,buf,0x400);
                  if (sVar3 == -1) {
                    if (*piVar2 == 0xb) {
                      sleep(1);
                      sVar3 = read(fd,&counter,8);
                      if (sVar3 == 8) {
                        if (counter == 1) {
                          sVar3 = read(fd,&counter,8);
                          if (sVar3 == -1) {
                            if (*piVar2 == 0xb) {
                              t2.it_value.tv_sec = 0;
                              t2.it_value.tv_nsec = 300000000;
                              t2.it_interval.tv_sec = 0;
                              t2.it_interval.tv_nsec = 200000000;
                              *piVar2 = 0;
                              iVar1 = timerfd_settime(fd,0,(itimerspec *)&t2,(itimerspec *)0x0);
                              if (iVar1 < 0) {
                                pcVar5 = "timerfd_settime(fd, 0, &t2, NULL)";
                              }
                              else {
                                if (*piVar2 == 0) {
                                  sVar3 = read(fd,buf,0x400);
                                  if (sVar3 == -1) {
                                    if (*piVar2 == 0xb) {
                                      iVar1 = usleep(400000);
                                      if (iVar1 == 0) {
                                        iVar1 = poll((pollfd *)&pfd,1,0);
                                        if (iVar1 == 1) {
                                          if (pfd.revents == 1) {
                                            iVar1 = usleep(400000);
                                            if (iVar1 == 0) {
                                              iVar1 = poll((pollfd *)&pfd,1,0);
                                              if (iVar1 == 1) {
                                                if (pfd.revents == 1) {
                                                  sVar3 = read(fd,&counter,8);
                                                  if (sVar3 == 8) {
                                                    if (counter < 3) {
                                                      pcVar7 = "(u64)3";
                                                      pcVar5 = "counter";
                                                      uVar8 = 0xcd;
                                                    }
                                                    else if (counter == 3) {
                                                      sVar3 = read(fd,&counter,8);
                                                      if (sVar3 == -1) {
                                                        if (*piVar2 == 0xb) {
                                                          usleep(400000);
                                                          iVar1 = poll((pollfd *)&pfd,1,0);
                                                          if (iVar1 != 1) {
                                                            pcVar7 = "1";
                                                            pcVar5 = "poll(&pfd, 1, 0)";
                                                            uVar8 = 0xd6;
                                                            goto LAB_00102f43;
                                                          }
                                                          t3.it_value.tv_sec = 0;
                                                          t3.it_value.tv_nsec = 0;
                                                          t3.it_interval.tv_sec = 0;
                                                          t3.it_interval.tv_nsec = 0;
                                                          *piVar2 = 0;
                                                          iVar1 = timerfd_settime(fd,0,(itimerspec *
                                                                                       )&t3,
                                                                                  (itimerspec *)0x0)
                                                          ;
                                                          if (iVar1 < 0) {
                                                            pcVar5 = 
                                                  "timerfd_settime(fd, 0, &t3, NULL)";
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      iVar1 = poll((pollfd *)&pfd,1,0);
                                                      if (iVar1 == 0) {
                                                        usleep(400000);
                                                        iVar1 = poll((pollfd *)&pfd,1,0);
                                                        if (iVar1 == 0) {
                                                          t4.it_value.tv_sec = 0;
                                                          t4.it_value.tv_nsec = 0;
                                                          t4.it_interval.tv_sec = 0;
                                                          t4.it_interval.tv_nsec = 0;
                                                          clock_gettime(clockid,(timespec *)
                                                                                &t4.it_value);
                                                          lVar4 = t4.it_value.tv_nsec + 300000000;
                                                          if (699999999 < t4.it_value.tv_nsec) {
                                                            t4.it_value.tv_sec =
                                                                 t4.it_value.tv_sec + 1;
                                                            lVar4 = t4.it_value.tv_nsec + -700000000
                                                            ;
                                                          }
                                                          t4.it_value.tv_nsec = lVar4;
                                                          *piVar2 = 0;
                                                          iVar1 = timerfd_settime(fd,1,(itimerspec *
                                                                                       )&t4,
                                                                                  (itimerspec *)0x0)
                                                          ;
                                                          if (iVar1 < 0) {
                                                            pcVar5 = 
                                                  "timerfd_settime(fd, TFD_TIMER_ABSTIME, &t4, NULL)"
                                                  ;
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      sVar3 = read(fd,buf,0x400);
                                                      if (sVar3 == -1) {
                                                        if (*piVar2 == 0xb) {
                                                          usleep(500000);
                                                          sVar3 = read(fd,&counter,8);
                                                          if (sVar3 == 8) {
                                                            if (counter == 1) {
                                                              sVar3 = read(fd,&counter,8);
                                                              if (sVar3 == -1) {
                                                                if (*piVar2 == 0xb) {
                                                                  t45.it_value.tv_sec = 0;
                                                                  t45.it_value.tv_nsec = 400000000;
                                                                  t45.it_interval.tv_sec = 0;
                                                                  t45.it_interval.tv_nsec = 0;
                                                                  *piVar2 = 0;
                                                                  iVar1 = timerfd_settime(fd,0,(
                                                  itimerspec *)&t45,(itimerspec *)0x0);
                                                  if (iVar1 < 0) {
                                                    pcVar5 = "timerfd_settime(fd, 0, &t45, NULL)";
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      tVar9 = steady_clock_now();
                                                      iVar1 = poll((pollfd *)&pfd,1,0);
                                                      if (iVar1 == 0) {
                                                        iVar1 = poll((pollfd *)&pfd,1,100);
                                                        if (iVar1 == 0) {
                                                          iVar1 = poll((pollfd *)&pfd,1,1000);
                                                          if (iVar1 == 1) {
                                                            tVar10 = steady_clock_now();
                                                            lVar6 = tVar10.tv_nsec - tVar9.tv_nsec;
                                                            lVar4 = lVar6 + 1000000000;
                                                            if (-1 < lVar6) {
                                                              lVar4 = lVar6;
                                                            }
                                                            if (((lVar6 >> 0x3f) +
                                                                (tVar10.tv_sec - tVar9.tv_sec)) *
                                                                1000000000 + lVar4 < 300000000) {
                                                              pcVar7 = "(int64_t)MS_TO_NSEC(300)";
                                                              pcVar5 = "nano_diff(after, before)";
                                                              uVar8 = 0xf6;
                                                            }
                                                            else {
                                                              *piVar2 = 0;
                                                              iVar1 = close(fd);
                                                              if (iVar1 < 0) {
                                                                pcVar5 = "close(fd)";
                                                              }
                                                              else {
                                                                if (*piVar2 == 0) {
                                                                  fd = timerfd_create(0,0);
                                                                  if (fd < 0) {
                                                                    pcVar5 = 
                                                  "timerfd_create(CLOCK_REALTIME, 0)";
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      t46.it_value.tv_sec = 10;
                                                      t46.it_value.tv_nsec = 0;
                                                      t46.it_interval.tv_sec = 0;
                                                      t46.it_interval.tv_nsec = 0;
                                                      pfd.fd = fd;
                                                      iVar1 = timerfd_settime(fd,0,(itimerspec *)
                                                                                   &t46,
                                                                              (itimerspec *)0x0);
                                                      if (iVar1 < 0) {
                                                        pcVar5 = 
                                                  "timerfd_settime(fd, 0, &t46, NULL)";
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      iVar1 = poll((pollfd *)&pfd,1,0);
                                                      if (iVar1 != 0) {
                                                        pcVar7 = "0";
                                                        pcVar5 = "poll(&pfd, 1, 0)";
                                                        uVar8 = 0x101;
                                                        goto LAB_00102f43;
                                                      }
                                                      *piVar2 = 0;
                                                      iVar1 = close(fd);
                                                      if (iVar1 < 0) {
                                                        pcVar5 = "close(fd)";
                                                      }
                                                      else {
                                                        if (*piVar2 == 0) {
                                                          fd = timerfd_create(0,0);
                                                          if (fd < 0) {
                                                            pcVar5 = 
                                                  "timerfd_create(CLOCK_REALTIME, 0)";
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      t5.it_value.tv_sec = 0;
                                                      t5.it_value.tv_nsec = 500000000;
                                                      t5.it_interval.tv_sec = 0;
                                                      t5.it_interval.tv_nsec = 0;
                                                      pfd.fd = fd;
                                                      iVar1 = timerfd_settime(fd,0,(itimerspec *)&t5
                                                                              ,(itimerspec *)0x0);
                                                      if (iVar1 < 0) {
                                                        pcVar5 = "timerfd_settime(fd, 0, &t5, NULL)"
                                                        ;
                                                      }
                                                      else {
                                                        if (*piVar2 == 0) {
                                                          tVar9 = steady_clock_now();
                                                          sVar3 = read(fd,&counter,8);
                                                          if (sVar3 == 8) {
                                                            if (counter == 1) {
                                                              tVar10 = steady_clock_now();
                                                              lVar6 = tVar10.tv_nsec - tVar9.tv_nsec
                                                              ;
                                                              lVar4 = lVar6 + 1000000000;
                                                              if (-1 < lVar6) {
                                                                lVar4 = lVar6;
                                                              }
                                                              if (((lVar6 >> 0x3f) +
                                                                  (tVar10.tv_sec - tVar9.tv_sec)) *
                                                                  1000000000 + lVar4 < 400000000) {
                                                                pcVar7 = "(int64_t)MS_TO_NSEC(400)";
                                                                pcVar5 = "nano_diff(after, before)";
                                                                uVar8 = 0x10f;
                                                              }
                                                              else {
                                                                iVar1 = pthread_create(&th2,(
                                                  pthread_attr_t *)0x0,th2_func,&fd);
                                                  if (iVar1 == 0) {
                                                    usleep(400000);
                                                    t6.it_value.tv_sec = 0;
                                                    t6.it_value.tv_nsec = 200000000;
                                                    t6.it_interval.tv_sec = 0;
                                                    t6.it_interval.tv_nsec = 0;
                                                    *piVar2 = 0;
                                                    iVar1 = timerfd_settime(fd,0,(itimerspec *)&t6,
                                                                            (itimerspec *)0x0);
                                                    if (iVar1 < 0) {
                                                      pcVar5 = "timerfd_settime(fd, 0, &t6, NULL)";
                                                    }
                                                    else {
                                                      if (*piVar2 == 0) {
                                                        iVar1 = pthread_join(th2,(void **)0x0);
                                                        if (iVar1 != 0) {
                                                          pcVar7 = "0";
                                                          pcVar5 = "pthread_join(th2, NULL)";
                                                          uVar8 = 0x117;
                                                          goto LAB_00102f43;
                                                        }
                                                        t7.it_value.tv_sec = 0;
                                                        t7.it_value.tv_nsec = 500000000;
                                                        t7.it_interval.tv_sec = 0;
                                                        t7.it_interval.tv_nsec = 200000000;
                                                        *piVar2 = 0;
                                                        iVar1 = timerfd_settime(fd,0,(itimerspec *)
                                                                                     &t7,(itimerspec
                                                                                          *)0x0);
                                                        if (iVar1 < 0) {
                                                          pcVar5 = 
                                                  "timerfd_settime(fd, 0, &t7, NULL)";
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      tVar9 = steady_clock_now();
                                                      sVar3 = read(fd,&counter,8);
                                                      if (sVar3 == 8) {
                                                        if (counter == 1) {
                                                          sVar3 = read(fd,&counter,8);
                                                          if (sVar3 == 8) {
                                                            if (counter == 1) {
                                                              tVar10 = steady_clock_now();
                                                              lVar6 = tVar10.tv_nsec - tVar9.tv_nsec
                                                              ;
                                                              lVar4 = lVar6 + 1000000000;
                                                              if (-1 < lVar6) {
                                                                lVar4 = lVar6;
                                                              }
                                                              if (((lVar6 >> 0x3f) +
                                                                  (tVar10.tv_sec - tVar9.tv_sec)) *
                                                                  1000000000 + lVar4 < 600000000) {
                                                                pcVar7 = "(int64_t)MS_TO_NSEC(600)";
                                                                pcVar5 = "nano_diff(after, before)";
                                                                uVar8 = 0x123;
                                                              }
                                                              else {
                                                                t8.it_value.tv_sec = 0;
                                                                t8.it_value.tv_nsec = 300000000;
                                                                t8.it_interval.tv_sec = 0;
                                                                t8.it_interval.tv_nsec = 400000000;
                                                                *piVar2 = 0;
                                                                iVar1 = timerfd_settime(fd,0,(
                                                  itimerspec *)&t8,(itimerspec *)0x0);
                                                  if (iVar1 < 0) {
                                                    pcVar5 = "timerfd_settime(fd, 0, &t8, NULL)";
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      iVar1 = timerfd_gettime(fd,(itimerspec *)&tout
                                                                             );
                                                      if (iVar1 < 0) {
                                                        pcVar5 = "timerfd_gettime(fd, &tout)";
                                                      }
                                                      else {
                                                        if (*piVar2 == 0) {
                                                          if (tout.it_interval.tv_sec ==
                                                              t8.it_interval.tv_sec) {
                                                            if (tout.it_interval.tv_nsec ==
                                                                t8.it_interval.tv_nsec) {
                                                              if (tout.it_value.tv_sec ==
                                                                  t8.it_value.tv_sec) {
                                                                if (t8.it_value.tv_nsec <
                                                                    tout.it_value.tv_nsec) {
                                                                  pcVar7 = "tout.it_value.tv_nsec";
                                                                  pcVar5 = "t8.it_value.tv_nsec";
                                                                  uVar8 = 0x12f;
                                                                }
                                                                else if (tout.it_value.tv_nsec <
                                                                         t8.it_value.tv_nsec +
                                                                         -100000000) {
                                                                  pcVar7 = 
                                                  "t8.it_value.tv_nsec - (long)MS_TO_NSEC(100)";
                                                  pcVar5 = "tout.it_value.tv_nsec";
                                                  uVar8 = 0x131;
                                                  }
                                                  else {
                                                    usleep(100000);
                                                    *piVar2 = 0;
                                                    iVar1 = timerfd_gettime(fd,(itimerspec *)&tout);
                                                    if (iVar1 < 0) {
                                                      pcVar5 = "timerfd_gettime(fd, &tout)";
                                                    }
                                                    else {
                                                      if (*piVar2 == 0) {
                                                        if (tout.it_interval.tv_sec ==
                                                            t8.it_interval.tv_sec) {
                                                          if (tout.it_interval.tv_nsec ==
                                                              t8.it_interval.tv_nsec) {
                                                            if (tout.it_value.tv_sec ==
                                                                t8.it_value.tv_sec) {
                                                              if (t8.it_value.tv_nsec + -100000000 <
                                                                  tout.it_value.tv_nsec) {
                                                                pcVar7 = "tout.it_value.tv_nsec";
                                                                pcVar5 = 
                                                  "t8.it_value.tv_nsec - (long)MS_TO_NSEC(100)";
                                                  uVar8 = 0x139;
                                                  }
                                                  else if (tout.it_value.tv_nsec <
                                                           t8.it_value.tv_nsec + -200000000) {
                                                    pcVar7 = 
                                                  "t8.it_value.tv_nsec - (long)MS_TO_NSEC(200)";
                                                  pcVar5 = "tout.it_value.tv_nsec";
                                                  uVar8 = 0x13c;
                                                  }
                                                  else {
                                                    usleep(300000);
                                                    *piVar2 = 0;
                                                    iVar1 = timerfd_gettime(fd,(itimerspec *)&tout);
                                                    if (iVar1 < 0) {
                                                      pcVar5 = "timerfd_gettime(fd, &tout)";
                                                    }
                                                    else {
                                                      if (*piVar2 == 0) {
                                                        if (tout.it_interval.tv_sec ==
                                                            t8.it_interval.tv_sec) {
                                                          if (tout.it_interval.tv_nsec ==
                                                              t8.it_interval.tv_nsec) {
                                                            if (tout.it_value.tv_sec ==
                                                                t8.it_value.tv_sec) {
                                                              if (tout.it_value.tv_nsec < 200000000)
                                                              {
                                                                pcVar7 = "(long)MS_TO_NSEC(200)";
                                                                pcVar5 = "tout.it_value.tv_nsec";
                                                                uVar8 = 0x145;
                                                              }
                                                              else if ((ulong)tout.it_value.tv_nsec
                                                                       < 0x17d78401) {
                                                                t9.it_value.tv_sec = 0;
                                                                t9.it_value.tv_nsec = 100000000;
                                                                t9.it_interval.tv_sec = 0;
                                                                t9.it_interval.tv_nsec = 0;
                                                                *piVar2 = 0;
                                                                iVar1 = timerfd_settime(fd,0,(
                                                  itimerspec *)&t9,(itimerspec *)0x0);
                                                  if (iVar1 < 0) {
                                                    pcVar5 = "timerfd_settime(fd, 0, &t9, NULL)";
                                                  }
                                                  else {
                                                    if (*piVar2 == 0) {
                                                      usleep(200000);
                                                      *piVar2 = 0;
                                                      iVar1 = timerfd_gettime(fd,(itimerspec *)&tout
                                                                             );
                                                      if (iVar1 < 0) {
                                                        pcVar5 = "timerfd_gettime(fd, &tout)";
                                                      }
                                                      else {
                                                        if (*piVar2 == 0) {
                                                          if (tout.it_interval.tv_sec == 0) {
                                                            if (tout.it_interval.tv_nsec == 0) {
                                                              if (tout.it_value.tv_sec == 0) {
                                                                if (tout.it_value.tv_nsec == 0) {
                                                                  return;
                                                                }
                                                                pcVar7 = "(long)0";
                                                                pcVar5 = "tout.it_value.tv_nsec";
                                                                uVar8 = 0x151;
                                                              }
                                                              else {
                                                                pcVar7 = "(long)0";
                                                                pcVar5 = "tout.it_value.tv_sec";
                                                                uVar8 = 0x150;
                                                              }
                                                            }
                                                            else {
                                                              pcVar7 = "(long)0";
                                                              pcVar5 = "tout.it_interval.tv_nsec";
                                                              uVar8 = 0x14f;
                                                            }
                                                          }
                                                          else {
                                                            pcVar7 = "(long)0";
                                                            pcVar5 = "tout.it_interval.tv_sec";
                                                            uVar8 = 0x14e;
                                                          }
                                                          goto LAB_00102f43;
                                                        }
                                                        pcVar5 = "timerfd_gettime(fd, &tout) errno";
                                                      }
                                                      pcVar7 = "0";
                                                      uVar8 = 0x14d;
                                                      goto LAB_00102f43;
                                                    }
                                                    pcVar5 = 
                                                  "timerfd_settime(fd, 0, &t9, NULL) errno";
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x14b;
                                                  }
                                                  else {
                                                    pcVar7 = "tout.it_value.tv_nsec";
                                                    pcVar5 = "(long)MS_TO_NSEC(400)";
                                                    uVar8 = 0x146;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_value.tv_sec";
                                                    pcVar5 = "tout.it_value.tv_sec";
                                                    uVar8 = 0x143;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_interval.tv_nsec";
                                                    pcVar5 = "tout.it_interval.tv_nsec";
                                                    uVar8 = 0x142;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_interval.tv_sec";
                                                    pcVar5 = "tout.it_interval.tv_sec";
                                                    uVar8 = 0x141;
                                                  }
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_gettime(fd, &tout) errno";
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x140;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_value.tv_sec";
                                                    pcVar5 = "tout.it_value.tv_sec";
                                                    uVar8 = 0x137;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_interval.tv_nsec";
                                                    pcVar5 = "tout.it_interval.tv_nsec";
                                                    uVar8 = 0x136;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_interval.tv_sec";
                                                    pcVar5 = "tout.it_interval.tv_sec";
                                                    uVar8 = 0x135;
                                                  }
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_gettime(fd, &tout) errno";
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x134;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_value.tv_sec";
                                                    pcVar5 = "tout.it_value.tv_sec";
                                                    uVar8 = 0x12e;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_interval.tv_nsec";
                                                    pcVar5 = "tout.it_interval.tv_nsec";
                                                    uVar8 = 0x12d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "t8.it_interval.tv_sec";
                                                    pcVar5 = "tout.it_interval.tv_sec";
                                                    uVar8 = 300;
                                                  }
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_gettime(fd, &tout) errno";
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 299;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_settime(fd, 0, &t8, NULL) errno"
                                                  ;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x128;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(u64)1";
                                                    pcVar5 = "counter";
                                                    uVar8 = 0x121;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(ssize_t)8";
                                                    pcVar5 = "read(fd, &counter, sizeof(counter))";
                                                    uVar8 = 0x120;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(u64)1";
                                                    pcVar5 = "counter";
                                                    uVar8 = 0x11f;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(ssize_t)8";
                                                    pcVar5 = "read(fd, &counter, sizeof(counter))";
                                                    uVar8 = 0x11e;
                                                  }
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_settime(fd, 0, &t7, NULL) errno"
                                                  ;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x11c;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_settime(fd, 0, &t6, NULL) errno"
                                                  ;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x116;
                                                  }
                                                  else {
                                                    pcVar7 = "0";
                                                    pcVar5 = 
                                                  "pthread_create(&th2, NULL, th2_func, &fd)";
                                                  uVar8 = 0x113;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(u64)1";
                                                    pcVar5 = "counter";
                                                    uVar8 = 0x10d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(ssize_t)8";
                                                    pcVar5 = "read(fd, &counter, sizeof(counter))";
                                                    uVar8 = 0x10c;
                                                  }
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_settime(fd, 0, &t5, NULL) errno"
                                                  ;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x10a;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_create(CLOCK_REALTIME, 0) errno"
                                                  ;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x105;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "close(fd) errno";
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x102;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = 
                                                  "timerfd_settime(fd, 0, &t46, NULL) errno";
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0x100;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_create(CLOCK_REALTIME, 0) errno"
                                                  ;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0xfd;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "close(fd) errno";
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0xf9;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "1";
                                                    pcVar5 = "poll(&pfd, 1, 1000 )";
                                                    uVar8 = 0xf4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "0";
                                                    pcVar5 = "poll(&pfd, 1, 100 )";
                                                    uVar8 = 0xf3;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "0";
                                                    pcVar5 = "poll(&pfd, 1, 0)";
                                                    uVar8 = 0xf2;
                                                  }
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = 
                                                  "timerfd_settime(fd, 0, &t45, NULL) errno";
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0xf0;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar7 = "EAGAIN";
                                                  pcVar5 = 
                                                  "read(fd, &counter, sizeof(counter)) errno";
                                                  }
                                                  else {
                                                    pcVar7 = "-1";
                                                    pcVar5 = "read(fd, &counter, sizeof(counter))";
                                                  }
                                                  uVar8 = 0xeb;
                                                  }
                                                  else {
                                                    pcVar7 = "(u64)1";
                                                    pcVar5 = "counter";
                                                    uVar8 = 0xea;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(ssize_t)8";
                                                    pcVar5 = "read(fd, &counter, sizeof(counter))";
                                                    uVar8 = 0xe9;
                                                  }
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar7 = "EAGAIN";
                                                  pcVar5 = "read(fd, buf, sizeof(buf)) errno";
                                                  }
                                                  else {
                                                    pcVar7 = "-1";
                                                    pcVar5 = "read(fd, buf, sizeof(buf))";
                                                  }
                                                  uVar8 = 0xe7;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = 
                                                  "timerfd_settime(fd, TFD_TIMER_ABSTIME, &t4, NULL) errno"
                                                  ;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0xe6;
                                                  }
                                                  else {
                                                    pcVar7 = "0";
                                                    pcVar5 = "poll(&pfd, 1, 0)";
                                                    uVar8 = 0xdb;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "0";
                                                    pcVar5 = "poll(&pfd, 1, 0)";
                                                    uVar8 = 0xd9;
                                                  }
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar5 = "timerfd_settime(fd, 0, &t3, NULL) errno"
                                                  ;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar8 = 0xd8;
                                                  goto LAB_00102f43;
                                                  }
                                                  pcVar7 = "EAGAIN";
                                                  pcVar5 = 
                                                  "read(fd, &counter, sizeof(counter)) errno";
                                                  }
                                                  else {
                                                    pcVar7 = "-1";
                                                    pcVar5 = "read(fd, &counter, sizeof(counter))";
                                                  }
                                                  uVar8 = 0xd1;
                                                  }
                                                  else {
                                                    pcVar7 = "(u64)3";
                                                    pcVar5 = "counter";
                                                    uVar8 = 0xcf;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(ssize_t)8";
                                                    pcVar5 = "read(fd, &counter, sizeof(counter))";
                                                    uVar8 = 0xcc;
                                                  }
                                                }
                                                else {
                                                  pcVar7 = "POLLIN";
                                                  pcVar5 = "(int)pfd.revents";
                                                  uVar8 = 0xcb;
                                                }
                                              }
                                              else {
                                                pcVar7 = "1";
                                                pcVar5 = "poll(&pfd, 1, 0)";
                                                uVar8 = 0xc9;
                                              }
                                            }
                                            else {
                                              pcVar7 = "0";
                                              pcVar5 = "usleep(400000)";
                                              uVar8 = 0xc5;
                                            }
                                          }
                                          else {
                                            pcVar7 = "POLLIN";
                                            pcVar5 = "(int)pfd.revents";
                                            uVar8 = 0xc4;
                                          }
                                        }
                                        else {
                                          pcVar7 = "1";
                                          pcVar5 = "poll(&pfd, 1, 0)";
                                          uVar8 = 0xc2;
                                        }
                                      }
                                      else {
                                        pcVar7 = "0";
                                        pcVar5 = "usleep(400000)";
                                        uVar8 = 0xbe;
                                      }
                                      goto LAB_00102f43;
                                    }
                                    pcVar7 = "EAGAIN";
                                    pcVar5 = "read(fd, buf, sizeof(buf)) errno";
                                  }
                                  else {
                                    pcVar7 = "-1";
                                    pcVar5 = "read(fd, buf, sizeof(buf))";
                                  }
                                  uVar8 = 0xbd;
                                  goto LAB_00102f43;
                                }
                                pcVar5 = "timerfd_settime(fd, 0, &t2, NULL) errno";
                              }
                              pcVar7 = "0";
                              uVar8 = 0xbc;
                              goto LAB_00102f43;
                            }
                            pcVar7 = "EAGAIN";
                            pcVar5 = "read(fd, &counter, sizeof(counter)) errno";
                          }
                          else {
                            pcVar7 = "-1";
                            pcVar5 = "read(fd, &counter, sizeof(counter))";
                          }
                          uVar8 = 0xb4;
                        }
                        else {
                          pcVar7 = "(u64)1";
                          pcVar5 = "counter";
                          uVar8 = 0xb3;
                        }
                      }
                      else {
                        pcVar7 = "(ssize_t)8";
                        pcVar5 = "read(fd, &counter, sizeof(counter))";
                        uVar8 = 0xb2;
                      }
                      goto LAB_00102f43;
                    }
                    pcVar7 = "EAGAIN";
                    pcVar5 = "read(fd, buf, sizeof(buf)) errno";
                  }
                  else {
                    pcVar7 = "-1";
                    pcVar5 = "read(fd, buf, sizeof(buf))";
                  }
                  uVar8 = 0xad;
                  goto LAB_00102f43;
                }
                pcVar5 = "timerfd_settime(fd, 0, &t1, NULL) errno";
              }
              pcVar7 = "0";
              uVar8 = 0xab;
              goto LAB_00102f43;
            }
            pcVar7 = "EINVAL";
            pcVar5 = "read(fd, buf, 7) errno";
          }
          else {
            pcVar7 = "-1";
            pcVar5 = "read(fd, buf, 7)";
          }
          uVar8 = 0xa7;
          goto LAB_00102f43;
        }
        pcVar7 = "EAGAIN";
        pcVar5 = "read(fd, buf, sizeof(buf)) errno";
      }
      else {
        pcVar7 = "-1";
        pcVar5 = "read(fd, buf, sizeof(buf))";
      }
      uVar8 = 0xa5;
      goto LAB_00102f43;
    }
    pcVar5 = "timerfd_create(clockid, TFD_NONBLOCK) errno";
  }
  pcVar7 = "0";
  uVar8 = 0x9e;
LAB_00102f43:
  fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n",pcVar7,pcVar5,
          "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
          ,uVar8);
  abort();
}

Assistant:

static void
dotest(int clockid)
{
	int fd;
	expect_success(fd, timerfd_create(clockid, TFD_NONBLOCK));
	int junk;

	// Before we set a timer, timerfd has no events for polling or reading
	struct pollfd pfd = { .fd = fd, .events = POLLIN };
	expect(poll(&pfd, 1, 0), 0);
	char buf[1024];
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	// Reading less than 8 bytes result in an error
	expect_errno(read(fd, buf, 7), EINVAL);

	// Set a timer to expire in 500ms from now (relative time)
	struct itimerspec t1 = { { 0, 0 }, { 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t1, NULL));
	// If we check now, the timer should have not yet expired
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	// But if we sleep for a whole second, the timer would have expired and
	// read returns a counter of 1
	sleep(1);
	u64 counter;
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// Similarly, set a timer to expire in 300ms, and then again every
	// 200ms. After 400ms, poll sees the timer expired at least once, but
	// we do not read. After 400ms more, we read and see the timer expired
	// 3 times.
	struct itimerspec t2 = { { 0, MS_TO_NSEC(200) },
		{ 0, MS_TO_NSEC(300) } };
	expect_success(junk, timerfd_settime(fd, 0, &t2, NULL));
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	expect(usleep(400000), 0);
#ifdef ALLOW_TIMER_SLACK
	expect(poll(&pfd, 1, -1), 1);
#else
	expect(poll(&pfd, 1, 0), 1);
#endif
	expect((int)pfd.revents, POLLIN);
	expect(usleep(400000), 0);
#ifdef ALLOW_TIMER_SLACK
	expect(poll(&pfd, 1, -1), 1);
#else
	expect(poll(&pfd, 1, 0), 1);
#endif
	expect((int)pfd.revents, POLLIN);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expectge(counter, (u64)3);
#ifndef ALLOW_TIMER_SLACK
	expect(counter, (u64)3);
#endif
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// If sleep (so counter becomes nonzero again) and then cancel the
	// timer, the counter remains zero
	usleep(400000);
	expect(poll(&pfd, 1, 0), 1); // counter is nonzero
	struct itimerspec t3 = { { 0, 0 }, { 0, 0 } };
	expect_success(junk, timerfd_settime(fd, 0, &t3, NULL));
	expect(poll(&pfd, 1, 0), 0); // counter is back to zero
	usleep(400000);
	expect(poll(&pfd, 1, 0), 0); // and timer was really canceled

	// Check absolute time setting
	// Set a timer to expire in 300ms from now (using absolute time)
	struct itimerspec t4 = { { 0, 0 }, { 0, 0 } };
	clock_gettime(clockid, &(t4.it_value));
	t4.it_value.tv_nsec += MS_TO_NSEC(300);
	if (t4.it_value.tv_nsec >= MS_TO_NSEC(1000)) {
		t4.it_value.tv_nsec -= MS_TO_NSEC(1000);
		t4.it_value.tv_sec++;
	}
	expect_success(junk, timerfd_settime(fd, TFD_TIMER_ABSTIME, &t4, NULL));
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	usleep(500000);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// Check blocking poll - simple case, no interval (see more complex
	// cases in blocking read tests below).
	struct itimerspec t45 = { { 0, 0 }, { 0, MS_TO_NSEC(400) } };
	expect_success(junk, timerfd_settime(fd, 0, &t45, NULL));
	struct timespec before = steady_clock_now();
	expect(poll(&pfd, 1, 0), 0);
	expect(poll(&pfd, 1, 100 /*ms*/), 0);
	expect(poll(&pfd, 1, 1000 /*ms*/), 1);
	struct timespec after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(300));

	// Check close
	expect_success(junk, close(fd));

	// Check that it's not a disaster to close an fd with a yet-unexpired
	// timer
	expect_success(fd, timerfd_create(CLOCK_REALTIME, 0));
	pfd.fd = fd;
	struct itimerspec t46 = { { 0, 0 }, { 10, 0 } };
	expect_success(junk, timerfd_settime(fd, 0, &t46, NULL));
	expect(poll(&pfd, 1, 0), 0);
	expect_success(junk, close(fd));

	// Open again with blocking read enabled
	expect_success(fd, timerfd_create(CLOCK_REALTIME, 0));
	pfd.fd = fd;

	// Check blocking read, no interval, timer set before read blocks
	struct itimerspec t5 = { { 0, 0 }, { 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t5, NULL));
	before = steady_clock_now();
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(400));

	// Check blocking read, no interval, timer set after read blocks
	pthread_t th2;
	expect(pthread_create(&th2, NULL, th2_func, &fd), 0);
	usleep(400000);
	struct itimerspec t6 = { { 0, 0 }, { 0, MS_TO_NSEC(200) } };
	expect_success(junk, timerfd_settime(fd, 0, &t6, NULL));
	expect(pthread_join(th2, NULL), 0);

	// Check blocking read, with interval
	struct itimerspec t7 = { { 0, MS_TO_NSEC(200) },
		{ 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t7, NULL));
	before = steady_clock_now();
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(600));

	// Check timerfd_gettime():
	struct itimerspec t8 = { { 0, MS_TO_NSEC(400) },
		{ 0, MS_TO_NSEC(300) } };
	expect_success(junk, timerfd_settime(fd, 0, &t8, NULL));
	struct itimerspec tout;
	// Right in the beginning:
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
	expectge(t8.it_value.tv_nsec, tout.it_value.tv_nsec);
	expectge(tout.it_value.tv_nsec,
	    t8.it_value.tv_nsec - (long)MS_TO_NSEC(100));
	// After a while but before expiration:
	usleep(100000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
	expectge(t8.it_value.tv_nsec - (long)MS_TO_NSEC(100),
	    tout.it_value.tv_nsec);
#ifndef ALLOW_TIMER_SLACK
	expectge(tout.it_value.tv_nsec,
	    t8.it_value.tv_nsec - (long)MS_TO_NSEC(200));
#endif
	// After expiration, we have the interval
	usleep(300000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
#ifndef ALLOW_TIMER_SLACK
	expectge(tout.it_value.tv_nsec, (long)MS_TO_NSEC(200));
	expectge((long)MS_TO_NSEC(400), tout.it_value.tv_nsec);
#endif

	// Check timerfd_gettime() after expiration of a single-time timer:
	struct itimerspec t9 = { { 0, 0 }, { 0, MS_TO_NSEC(100) } };
	expect_success(junk, timerfd_settime(fd, 0, &t9, NULL));
	usleep(200000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, (long)0);
	expect(tout.it_interval.tv_nsec, (long)0);
	expect(tout.it_value.tv_sec, (long)0);
	expect(tout.it_value.tv_nsec, (long)0);
	expect(tout.it_value.tv_nsec, (long)0);
}